

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
::logAndSetTestResult
          (RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
           *this,vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult>_>
                 *results)

{
  deUint64 *pdVar1;
  TestContext *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  deUint64 dVar4;
  deUint64 dVar5;
  deUint64 dVar6;
  deUint64 dVar7;
  deUint64 dVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  long lVar14;
  pointer pRVar15;
  pointer pSVar16;
  undefined8 *puVar17;
  int precision;
  void *pvVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  RenderSampleAnalyzeResult RVar22;
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
  mappedResults;
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
  local_88;
  string local_70;
  long local_50;
  void *local_48;
  ulong local_40;
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
  *local_38;
  
  local_88.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar14 = (long)(results->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(results->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4;
  uVar19 = lVar14 * -0x3333333333333333;
  pvVar18 = (void *)0x0;
  if (uVar19 != 0) {
    lVar20 = 0;
    if (uVar19 == 0) {
      uRam0000000000000030 = 0;
      uRam0000000000000038 = 0;
      uRam0000000000000020 = 0;
      uRam0000000000000028 = 0;
      uRam0000000000000010 = 0;
      uRam0000000000000018 = 0;
      uRam0000000000000000 = 0;
      uRam0000000000000008 = 0;
      local_88.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(lVar14 * 0x3333333333333340);
      puVar17 = (undefined8 *)0x40;
      do {
        uVar13 = uRam0000000000000038;
        uVar12 = uRam0000000000000028;
        uVar11 = uRam0000000000000020;
        uVar10 = uRam0000000000000018;
        uVar9 = uRam0000000000000010;
        uVar3 = uRam0000000000000008;
        uVar2 = uRam0000000000000000;
        puVar17[6] = uRam0000000000000030;
        puVar17[7] = uVar13;
        puVar17[4] = uVar11;
        puVar17[5] = uVar12;
        puVar17[2] = uVar9;
        puVar17[3] = uVar10;
        *puVar17 = uVar2;
        puVar17[1] = uVar3;
        puVar17 = puVar17 + 8;
      } while ((undefined8 *)(lVar14 * 0x3333333333333340) != puVar17);
    }
    else {
      if (0x1ffffffffffffff < uVar19) {
        std::__throw_length_error("vector::_M_default_append");
      }
      local_40 = uVar19;
      if (0x1fffffffffffffe < uVar19) {
        local_40 = 0x1ffffffffffffff;
      }
      local_38 = this;
      if (local_40 == 0) {
        pRVar15 = (pointer)0x0;
      }
      else {
        local_50 = 0;
        local_48 = (void *)0x0;
        pRVar15 = (pointer)operator_new(local_40 << 6);
        pvVar18 = local_48;
        lVar20 = local_50;
      }
      (pRVar15->duration).renderReadDuration = 0;
      (pRVar15->duration).fitResponseDuration = 0;
      (pRVar15->duration).readDuration = 0;
      (pRVar15->duration).totalDuration = 0;
      (pRVar15->duration).uploadDuration = 0;
      (pRVar15->duration).renderDuration = 0;
      pRVar15->uploadedDataSize = 0;
      pRVar15->renderDataSize = 0;
      pRVar15->unrelatedDataSize = 0;
      pRVar15->numVertices = 0;
      if ((uVar19 - 1 != 0) && ((uVar19 - 1 & 0x3ffffffffffffff) != 0)) {
        lVar21 = 0x40;
        do {
          uVar2 = *(undefined8 *)pRVar15;
          uVar3 = *(undefined8 *)&pRVar15->unrelatedDataSize;
          dVar4 = (pRVar15->duration).uploadDuration;
          dVar5 = (pRVar15->duration).renderDuration;
          dVar6 = (pRVar15->duration).readDuration;
          dVar7 = (pRVar15->duration).totalDuration;
          dVar8 = (pRVar15->duration).fitResponseDuration;
          pdVar1 = (deUint64 *)((long)&(pRVar15->duration).renderReadDuration + lVar21);
          *pdVar1 = (pRVar15->duration).renderReadDuration;
          pdVar1[1] = dVar8;
          pdVar1 = (deUint64 *)((long)&(pRVar15->duration).readDuration + lVar21);
          *pdVar1 = dVar6;
          pdVar1[1] = dVar7;
          pdVar1 = (deUint64 *)((long)&(pRVar15->duration).uploadDuration + lVar21);
          *pdVar1 = dVar4;
          pdVar1[1] = dVar5;
          puVar17 = (undefined8 *)((long)&pRVar15->uploadedDataSize + lVar21);
          *puVar17 = uVar2;
          puVar17[1] = uVar3;
          lVar21 = lVar21 + 0x40;
        } while (lVar14 * 0x3333333333333340 != lVar21);
      }
      if (pvVar18 != (void *)0x0) {
        operator_delete(pvVar18,lVar20 - (long)pvVar18);
      }
      local_88.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar15 + lVar14 * 0xcccccccccccccd;
      local_88.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar15 + local_40;
      this = local_38;
      local_88.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pRVar15;
    }
  }
  pSVar16 = (results->
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(results->
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar16) >> 4) *
          -0x33333333) {
    lVar14 = 0x10;
    lVar20 = 0;
    pRVar15 = local_88.
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      puVar17 = (undefined8 *)((long)&(pSVar16->scene).gridWidth + lVar14);
      uVar2 = *puVar17;
      uVar3 = puVar17[1];
      pdVar1 = (deUint64 *)((long)&(pSVar16->result).uploadedDataSize + lVar14);
      dVar4 = *pdVar1;
      dVar5 = pdVar1[1];
      pdVar1 = (deUint64 *)((long)&(pSVar16->result).duration.uploadDuration + lVar14);
      dVar6 = *pdVar1;
      dVar7 = pdVar1[1];
      pdVar1 = (deUint64 *)((long)&(pSVar16->result).duration.readDuration + lVar14);
      dVar8 = pdVar1[1];
      (pRVar15->duration).renderReadDuration = *pdVar1;
      (pRVar15->duration).fitResponseDuration = dVar8;
      (pRVar15->duration).readDuration = dVar6;
      (pRVar15->duration).totalDuration = dVar7;
      (pRVar15->duration).uploadDuration = dVar4;
      (pRVar15->duration).renderDuration = dVar5;
      pRVar15->uploadedDataSize = (int)uVar2;
      pRVar15->renderDataSize = (int)((ulong)uVar2 >> 0x20);
      pRVar15->unrelatedDataSize = (int)uVar3;
      pRVar15->numVertices = (int)((ulong)uVar3 >> 0x20);
      lVar20 = lVar20 + 1;
      pSVar16 = (results->
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pRVar15 = pRVar15 + 1;
      lVar14 = lVar14 + 0x50;
    } while (lVar20 < (int)((ulong)((long)(results->
                                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pSVar16) >> 4) * -0x33333333);
  }
  RVar22 = analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                     (((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log,&local_88);
  this_00 = (this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
            m_testCtx;
  if (RVar22.renderRateAtRange < INFINITY) {
    de::floatToString_abi_cxx11_
              (&local_70,(de *)0x2,RVar22.renderRateAtRange * 0.0009765625 * 0.0009765625,precision)
    ;
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_70._M_dataplus._M_p);
  }
  else {
    de::floatToString_abi_cxx11_(&local_70,(de *)0x2,0.0,precision);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_88.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void RenderCase<SampleType>::logAndSetTestResult (const std::vector<SampleResult>& results)
{
	std::vector<RenderSampleResult<SampleType> > mappedResults;

	mapResultsToRenderRateFormat(mappedResults, results);

	{
		const RenderSampleAnalyzeResult	analysis	= analyzeSampleResults(m_testCtx.getLog(), mappedResults);
		const float						rate		= analysis.renderRateAtRange;

		if (rate == std::numeric_limits<float>::infinity())
		{
			// sample times are 1) invalid or 2) timer resolution too low
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(0.0f, 2).c_str());
		}
		else
		{
			// report transfer rate in millions of MiB/s
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(rate / 1024.0f / 1024.0f, 2).c_str());
		}
	}
}